

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileOptions *orig_options,FileDescriptor *descriptor)

{
  FileDescriptor *in_RDX;
  vector<int,_std::allocator<int>_> options_path;
  vector<int,_std::allocator<int>_> *in_stack_00000088;
  FileDescriptor *in_stack_00000090;
  OptionsType *in_stack_00000098;
  string *in_stack_000000a0;
  string *in_stack_000000a8;
  DescriptorBuilder *in_stack_000000b0;
  value_type_conflict2 *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *this_00;
  string local_68 [8];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> local_30;
  FileDescriptor *local_18;
  
  this_00 = &local_30;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49f925);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  FileDescriptor::package_abi_cxx11_(local_18);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  FileDescriptor::name_abi_cxx11_(local_18);
  AllocateOptionsImpl<google::protobuf::FileDescriptor>
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::~string(local_68);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileOptions& orig_options,
                                        FileDescriptor* descriptor) {
  std::vector<int> options_path;
  options_path.push_back(FileDescriptorProto::kOptionsFieldNumber);
  // We add the dummy token so that LookupSymbol does the right thing.
  AllocateOptionsImpl(descriptor->package() + ".dummy", descriptor->name(),
                      orig_options, descriptor, options_path);
}